

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O2

void * des3_ctx_alloc(void)

{
  mbedtls_des3_context *ctx;
  
  ctx = (mbedtls_des3_context *)calloc(1,0x180);
  if (ctx != (mbedtls_des3_context *)0x0) {
    mbedtls_des3_init(ctx);
  }
  return ctx;
}

Assistant:

static void * des3_ctx_alloc( void )
{
    mbedtls_des3_context *des3;
    des3 = mbedtls_calloc( 1, sizeof( mbedtls_des3_context ) );

    if( des3 == NULL )
        return( NULL );

    mbedtls_des3_init( des3 );

    return( des3 );
}